

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

int pulse_device_collection_destroy(cubeb_conflict *ctx,cubeb_device_collection *collection)

{
  long lVar1;
  ulong uVar2;
  
  if (collection->count != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      free(*(void **)((long)&collection->device->friendly_name + lVar1));
      free(*(void **)((long)&collection->device->vendor_name + lVar1));
      free(*(void **)((long)&collection->device->group_id + lVar1));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x58;
    } while (uVar2 < collection->count);
  }
  free(collection->device);
  return 0;
}

Assistant:

static int
pulse_device_collection_destroy(cubeb * ctx, cubeb_device_collection * collection)
{
  size_t n;

  for (n = 0; n < collection->count; n++) {
    free((void *) collection->device[n].friendly_name);
    free((void *) collection->device[n].vendor_name);
    free((void *) collection->device[n].group_id);
  }

  free(collection->device);
  return CUBEB_OK;
}